

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O2

void RPerm(Sarray *A,Sarray *B,vector<unsigned_long,_std::allocator<unsigned_long>_> *C,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *D)

{
  int RIndex;
  int index;
  
  for (index = 0; index != 0x18; index = index + 1) {
    Theta(A,B,C,D);
    Rho(B,A);
    Pi(A,B);
    Chi(B,A);
    Iota(A,index);
  }
  return;
}

Assistant:

void RPerm(Sarray &A, Sarray& B, vector<uint64_t> &C, vector<uint64_t> &D){
    for(int RIndex = 0; RIndex < 24; RIndex++){
        Theta(A, B, C, D);
        Rho(B, A);
        Pi(A, B);
        Chi(B, A);
        Iota(A, RIndex);
    }
}